

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall common_log::common_log(common_log *this,size_t capacity)

{
  bool bVar1;
  pointer pcVar2;
  vector<char,_std::allocator<char>_> *in_RDI;
  common_log_entry *entry;
  iterator __end1;
  iterator __begin1;
  vector<common_log_entry,_std::allocator<common_log_entry>_> *__range1;
  vector<common_log_entry,_std::allocator<common_log_entry>_> *in_stack_ffffffffffffff88;
  pointer *__lhs;
  pointer *__new_size;
  common_log *in_stack_ffffffffffffffc0;
  __normal_iterator<common_log_entry_*,_std::vector<common_log_entry,_std::allocator<common_log_entry>_>_>
  local_30;
  vector<char,_std::allocator<char>_> *local_28;
  
  std::mutex::mutex((mutex *)0x35a2cd);
  __lhs = (pointer *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  std::thread::thread((thread *)0x35a2e0);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 2));
  std::vector<common_log_entry,_std::allocator<common_log_entry>_>::vector
            ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)0x35a306);
  __new_size = (pointer *)
               &in_RDI[6].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  common_log_entry::common_log_entry((common_log_entry *)0x35a31c);
  *(undefined8 *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = 0;
  in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x9 = 0;
  in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xa = 0;
  pcVar2 = (pointer)t_us();
  *(pointer *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 = pcVar2
  ;
  std::vector<common_log_entry,_std::allocator<common_log_entry>_>::resize
            ((vector<common_log_entry,_std::allocator<common_log_entry>_> *)in_RDI,
             (size_type)__new_size);
  local_28 = in_RDI + 5;
  local_30._M_current =
       (common_log_entry *)
       std::vector<common_log_entry,_std::allocator<common_log_entry>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<common_log_entry,_std::allocator<common_log_entry>_>::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<common_log_entry_*,_std::vector<common_log_entry,_std::allocator<common_log_entry>_>_>
                        *)__lhs,(__normal_iterator<common_log_entry_*,_std::vector<common_log_entry,_std::allocator<common_log_entry>_>_>
                                 *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 =
         (common_log *)
         __gnu_cxx::
         __normal_iterator<common_log_entry_*,_std::vector<common_log_entry,_std::allocator<common_log_entry>_>_>
         ::operator*(&local_30);
    std::vector<char,_std::allocator<char>_>::resize(in_RDI,(size_type)__new_size);
    __gnu_cxx::
    __normal_iterator<common_log_entry_*,_std::vector<common_log_entry,_std::allocator<common_log_entry>_>_>
    ::operator++(&local_30);
  }
  *(undefined8 *)&in_RDI[6].super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
  *(pointer *)&in_RDI[6].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 =
       (pointer)0x0;
  resume(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

common_log(size_t capacity) {
        file = nullptr;
        prefix = false;
        timestamps = false;
        running = false;
        t_start = t_us();

        // initial message size - will be expanded if longer messages arrive
        entries.resize(capacity);
        for (auto & entry : entries) {
            entry.msg.resize(256);
        }

        head = 0;
        tail = 0;

        resume();
    }